

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

bool __thiscall
Memory::LargeHeapBlock::GetObjectHeader
          (LargeHeapBlock *this,void *objectAddress,LargeObjectHeader **ppHeader)

{
  code *pcVar1;
  bool bVar2;
  LargeObjectHeader *pLVar3;
  undefined4 *puVar4;
  
  *ppHeader = (LargeObjectHeader *)0x0;
  pLVar3 = GetHeader(this,objectAddress);
  if ((pLVar3 < (LargeObjectHeader *)(this->super_HeapBlock).address) ||
     ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[pLVar3->objectIndex] != pLVar3
     )) {
    bVar2 = false;
  }
  else {
    if (this->allocCount <= pLVar3->objectIndex) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x379,"(index < this->allocCount)","index < this->allocCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    *ppHeader = pLVar3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool
LargeHeapBlock::GetObjectHeader(void* objectAddress, LargeObjectHeader** ppHeader)
{
    (*ppHeader) = nullptr;

    LargeObjectHeader * header = GetHeader(objectAddress);
    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    Assert(index < this->allocCount);
    (*ppHeader) = header;
    return true;
}